

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

void Dch_DeriveChoiceAigNode
               (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Aig_Obj_t *pObj,int fSkipRedSupps)

{
  int *piVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar8;
  Aig_Obj_t *pAVar9;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar13;
  bool bVar14;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x1be,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)")
    ;
  }
  bVar4 = true;
  if ((pAigOld->pReprs == (Aig_Obj_t **)0x0) ||
     (pAVar12 = pAigOld->pReprs[pObj->Id], pAVar12 == (Aig_Obj_t *)0x0)) {
    pAVar12 = (Aig_Obj_t *)0x0;
  }
  else {
    if (((ulong)pAVar12 & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar5 = (uint)*(undefined8 *)&pAVar12->field_0x18;
    if ((ulong)(uVar5 & 7) - 1 < 2) {
      if ((pAVar12->field_5).pData != (void *)0x0) {
        (pObj->field_5).pData =
             (void *)((ulong)((uVar5 ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^
                     (ulong)(pAVar12->field_5).pData);
        return;
      }
      __assert_fail("pRepr->pData != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                    ,0x1c3,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    bVar4 = false;
  }
  uVar7 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  if (uVar7 == 0) {
    pAVar11 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar11 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar7 + 0x28));
  }
  ppAVar2 = pAigNew->pReprs;
  if (ppAVar2 != (Aig_Obj_t **)0x0) {
    pAVar9 = ppAVar2[*(int *)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x24)];
    if (pAVar9 != (Aig_Obj_t *)0x0) {
      pAVar11 = (Aig_Obj_t *)
                ((ulong)(((uint)pAVar11 ^
                         (*(uint *)&pAVar9->field_0x18 ^
                         *(uint *)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18)) >> 3) & 1) ^
                (ulong)pAVar9);
    }
  }
  uVar7 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (uVar7 == 0) {
    pAVar9 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar9 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar7 + 0x28));
  }
  if (ppAVar2 != (Aig_Obj_t **)0x0) {
    pAVar3 = ppAVar2[*(int *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x24)];
    if (pAVar3 != (Aig_Obj_t *)0x0) {
      pAVar9 = (Aig_Obj_t *)
               ((ulong)(((uint)pAVar9 ^
                        (*(uint *)&pAVar3->field_0x18 ^
                        *(uint *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18)) >> 3) & 1) ^
               (ulong)pAVar3);
    }
  }
  aVar8.pData = Aig_And(pAigNew,pAVar11,pAVar9);
  aVar10.pData = aVar8.pData;
  while (aVar13.pData = aVar8.pData, pAigNew->pReprs != (Aig_Obj_t **)0x0) {
    pAVar11 = pAigNew->pReprs[*(int *)(((ulong)aVar10.pData & 0xfffffffffffffffe) + 0x24)];
    aVar13 = aVar10;
    if ((pAVar11 == (Aig_Obj_t *)0x0) ||
       (aVar13.pData = (void *)((ulong)((aVar10.iData ^
                                        (*(uint *)&pAVar11->field_0x18 ^
                                        *(uint *)(((ulong)aVar10.pData & 0xfffffffffffffffe) + 0x18)
                                        ) >> 3) & 1) ^ (ulong)pAVar11),
       bVar14 = aVar10.pData == aVar13.pData, aVar10.pData = aVar13.pData, bVar14)) break;
  }
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("pObj->pData == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x1d5,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)")
    ;
  }
  pObj->field_5 = aVar13;
  if (!bVar4) {
    if (pObj->Id <= pAVar12->Id) {
      __assert_fail("pRepr->Id < pObj->Id",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                    ,0x1da,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    if ((*(uint *)&pAVar12->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pRepr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                    ,0x1db,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar11 = (Aig_Obj_t *)((ulong)aVar13.pData & 0xfffffffffffffffe);
    pAVar12 = (Aig_Obj_t *)((ulong)(pAVar12->field_5).pData & 0xfffffffffffffffe);
    if (pAVar12->Id < pAVar11->Id) {
      if (pAigNew->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAigNew->pReprs[pAVar11->Id] = pAVar12;
      if ((((*(uint *)&pAVar11->field_0x18 & 0xffffffc0) == 0) &&
          (iVar6 = Dch_ObjCheckTfi(pAigNew,pAVar11,pAVar12), iVar6 == 0)) &&
         ((fSkipRedSupps == 0 || (iVar6 = Dch_ObjCheckSuppRed(pAigNew,pAVar11,pAVar12), iVar6 == 0))
         )) {
        do {
          piVar1 = &pAVar12->Id;
          pAVar12 = pAigNew->pEquivs[*piVar1];
        } while (pAVar12 != (Aig_Obj_t *)0x0);
        pAigNew->pEquivs[*piVar1] = pAVar11;
      }
    }
  }
  return;
}

Assistant:

void Dch_DeriveChoiceAigNode( Aig_Man_t * pAigNew, Aig_Man_t * pAigOld, Aig_Obj_t * pObj, int fSkipRedSupps )
{
    Aig_Obj_t * pRepr, * pObjNew, * pReprNew;
    assert( !Aig_IsComplement(pObj) );
    // get the representative
    pRepr = Aig_ObjRepr( pAigOld, pObj );
    if ( pRepr != NULL && (Aig_ObjIsConst1(pRepr) || Aig_ObjIsCi(pRepr)) )
    {
        assert( pRepr->pData != NULL );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pObj->fPhase ^ pRepr->fPhase );
        return;
    }
    // get the new node
    pObjNew = Aig_And( pAigNew, 
        Aig_ObjChild0CopyRepr(pAigNew, pObj), 
        Aig_ObjChild1CopyRepr(pAigNew, pObj) );
//    pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew );
    while ( 1 ) 
    {
        Aig_Obj_t * pObjNew2 = pObjNew;
        pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew2 );
        if ( pObjNew == pObjNew2 )
            break;
    }
//    assert( Aig_ObjRepr( pAigNew, pObjNew ) == NULL );
    // assign the copy
    assert( pObj->pData == NULL );
    pObj->pData = pObjNew;
    // skip those without reprs
    if ( pRepr == NULL )
        return;
    assert( pRepr->Id < pObj->Id );
    assert( Aig_ObjIsNode(pRepr) );
    // get the corresponding new nodes
    pObjNew  = Aig_Regular((Aig_Obj_t *)pObj->pData);
    pReprNew = Aig_Regular((Aig_Obj_t *)pRepr->pData);
    // skip earlier nodes
    if ( pReprNew->Id >= pObjNew->Id )
        return;
    assert( pReprNew->Id < pObjNew->Id );
    // set the representatives
    Aig_ObjSetRepr( pAigNew, pObjNew, pReprNew );
    // skip used nodes
    if ( pObjNew->nRefs > 0 )
        return;
    assert( pObjNew->nRefs == 0 );
    // skip choices that can lead to combo loops
    if ( Dch_ObjCheckTfi( pAigNew, pObjNew, pReprNew ) )
        return;
    // don't add choice if structural support of pObjNew and pReprNew differ
    if ( fSkipRedSupps && Dch_ObjCheckSuppRed(pAigNew, pObjNew, pReprNew) )
        return;
    // add choice to the end of the list
    while ( pAigNew->pEquivs[pReprNew->Id] != NULL )
        pReprNew = pAigNew->pEquivs[pReprNew->Id];
    assert( pAigNew->pEquivs[pReprNew->Id] == NULL );
    pAigNew->pEquivs[pReprNew->Id] = pObjNew;
}